

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_substr_compare(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int local_58;
  int local_54;
  int rc;
  int iCase;
  int nSublen;
  int nSrcLen;
  int nLen;
  int nOfft;
  char *zSub;
  char *zOfft;
  char *zSource;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  local_54 = 0;
  zSource = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 3) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zOfft = jx9_value_to_string(*apArg,&iCase);
    if (iCase < 1) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      nSublen = iCase;
      _nLen = jx9_value_to_string(*(jx9_value **)(zSource + 8),&rc);
      if ((rc < 1) || (iCase < rc)) {
        jx9_result_bool(pjStack_18,0);
      }
      else {
        nSrcLen = jx9_value_to_int(*(jx9_value **)(zSource + 0x10));
        if (nSrcLen < 0) {
          zSub = zOfft + (iCase + nSrcLen);
          if (zSub < zOfft) {
            jx9_result_bool(pjStack_18,0);
            return 0;
          }
          nSublen = ((int)zOfft + iCase) - (int)zSub;
          nSrcLen = (int)zSub - (int)zOfft;
        }
        else {
          if (iCase <= nSrcLen) {
            jx9_result_bool(pjStack_18,0);
            return 0;
          }
          zSub = zOfft + nSrcLen;
          nSublen = iCase - nSrcLen;
        }
        if (3 < apArg_local._4_4_) {
          nSublen = jx9_value_to_int(*(jx9_value **)(zSource + 0x18));
          if (nSublen < 1) {
            jx9_result_int(pjStack_18,1);
            return 0;
          }
          if (iCase < nSublen + nSrcLen) {
            nSublen = iCase - nSrcLen;
          }
          if (4 < apArg_local._4_4_) {
            local_54 = jx9_value_to_bool(*(jx9_value **)(zSource + 0x20));
          }
        }
        if (local_54 == 0) {
          local_58 = SyStrncmp(zSub,_nLen,nSublen);
        }
        else {
          local_58 = SyStrnicmp(zSub,_nLen,nSublen);
        }
        jx9_result_int(pjStack_18,local_58);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_substr_compare(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zSource, *zOfft, *zSub;
	int nOfft, nLen, nSrcLen, nSublen;
	int iCase = 0;
	int rc;
	if( nArg < 3 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zSource = jx9_value_to_string(apArg[0], &nSrcLen);
	if( nSrcLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nLen = nSrcLen; /* cc warning */
	/* Extract the substring */
	zSub = jx9_value_to_string(apArg[1], &nSublen);
	if( nSublen < 1 || nSublen > nSrcLen){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the offset */
	nOfft = jx9_value_to_int(apArg[2]);
	if( nOfft < 0 ){
		zOfft = &zSource[nSrcLen+nOfft]; 
		if( zOfft < zSource ){
			/* Invalid offset */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		nLen = (int)(&zSource[nSrcLen]-zOfft);
		nOfft = (int)(zOfft-zSource);
	}else if( nOfft >= nSrcLen ){
		/* Invalid offset */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}else{
		zOfft = &zSource[nOfft];
		nLen = nSrcLen - nOfft;
	}
	if( nArg > 3 ){
		/* Extract the length */
		nLen = jx9_value_to_int(apArg[3]);
		if( nLen < 1 ){
			/* Invalid  length */
			jx9_result_int(pCtx, 1);
			return JX9_OK;
		}else if( nLen + nOfft > nSrcLen ){
			/* Invalid length */
			nLen = nSrcLen - nOfft;
		}
		if( nArg > 4 ){
			/* Case-sensitive or not */
			iCase = jx9_value_to_bool(apArg[4]);
		}
	}
	/* Perform the comparison */
	if( iCase ){
		rc = SyStrnicmp(zOfft, zSub, (sxu32)nLen);
	}else{
		rc = SyStrncmp(zOfft, zSub, (sxu32)nLen);
	}
	/* Comparison result */
	jx9_result_int(pCtx, rc);
	return JX9_OK;
}